

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

void clear_mqtt_options(MQTT_CLIENT *mqtt_client)

{
  char *pcVar1;
  
  pcVar1 = (mqtt_client->mqttOptions).clientId;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    (mqtt_client->mqttOptions).clientId = (char *)0x0;
  }
  pcVar1 = (mqtt_client->mqttOptions).willTopic;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    (mqtt_client->mqttOptions).willTopic = (char *)0x0;
  }
  pcVar1 = (mqtt_client->mqttOptions).willMessage;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    (mqtt_client->mqttOptions).willMessage = (char *)0x0;
  }
  pcVar1 = (mqtt_client->mqttOptions).username;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    (mqtt_client->mqttOptions).username = (char *)0x0;
  }
  pcVar1 = (mqtt_client->mqttOptions).password;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
    (mqtt_client->mqttOptions).password = (char *)0x0;
  }
  return;
}

Assistant:

static void clear_mqtt_options(MQTT_CLIENT* mqtt_client)
{
    if (mqtt_client->mqttOptions.clientId != NULL)
    {
        free(mqtt_client->mqttOptions.clientId);
        mqtt_client->mqttOptions.clientId = NULL;
    }

    if (mqtt_client->mqttOptions.willTopic != NULL)
    {
        free(mqtt_client->mqttOptions.willTopic);
        mqtt_client->mqttOptions.willTopic = NULL;
    }

    if (mqtt_client->mqttOptions.willMessage != NULL)
    {
        free(mqtt_client->mqttOptions.willMessage);
        mqtt_client->mqttOptions.willMessage = NULL;
    }

    if (mqtt_client->mqttOptions.username != NULL)
    {
        free(mqtt_client->mqttOptions.username);
        mqtt_client->mqttOptions.username = NULL;
    }

    if (mqtt_client->mqttOptions.password != NULL)
    {
        free(mqtt_client->mqttOptions.password);
        mqtt_client->mqttOptions.password = NULL;
    }
}